

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

char __thiscall smf::Options::getChar(Options *this,string *optionName)

{
  char cVar1;
  string local_30;
  
  getString(&local_30,this,optionName);
  cVar1 = *local_30._M_dataplus._M_p;
  std::__cxx11::string::~string((string *)&local_30);
  return cVar1;
}

Assistant:

char Options::getChar(const std::string& optionName) {
   return getString(optionName).c_str()[0];
}